

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O1

void __thiscall
helics::ConnectorFederateManager::disconnectAllConnectors(ConnectorFederateManager *this)

{
  uint uVar1;
  Translator *this_00;
  int iVar2;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *puVar3;
  Translator **ppTVar4;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **ppuVar5;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **ppuVar6;
  Translator **ppTVar7;
  int iVar8;
  ulong uVar9;
  handle trans;
  handle filts;
  handle local_60;
  handle local_48;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&local_48,&this->filters);
  if (((local_48.data)->dataStorage).csize == 0) {
    uVar9 = (ulong)((local_48.data)->dataStorage).bsize;
    ppuVar6 = ((local_48.data)->dataStorage).dataptr;
    if (uVar9 == 0x20) {
      if (ppuVar6 == (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
        ppuVar6 = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)
                  &gmlc::containers::
                   StableBlockVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,5u,std::allocator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>>
                   ::end()::emptyValue;
      }
      else {
        ppuVar6 = ppuVar6 + (long)((local_48.data)->dataStorage).dataSlotIndex + 1;
      }
      goto LAB_0021d44f;
    }
    ppuVar6 = ppuVar6 + ((local_48.data)->dataStorage).dataSlotIndex;
    puVar3 = *ppuVar6 + uVar9;
  }
  else {
    ppuVar6 = ((local_48.data)->dataStorage).dataptr;
LAB_0021d44f:
    puVar3 = *ppuVar6;
    uVar9 = 0;
  }
  iVar2 = ((local_48.data)->dataStorage).bsize;
  ppuVar5 = ((local_48.data)->dataStorage).dataptr;
  if (iVar2 == 0x20) {
    if (ppuVar5 == (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
      ppuVar5 = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)
                &gmlc::containers::
                 StableBlockVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,5u,std::allocator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>>
                 ::end()::emptyValue;
    }
    else {
      ppuVar5 = ppuVar5 + (long)((local_48.data)->dataStorage).dataSlotIndex + 1;
    }
    iVar2 = 0;
  }
  else {
    ppuVar5 = ppuVar5 + ((local_48.data)->dataStorage).dataSlotIndex;
  }
  while ((iVar8 = (int)uVar9, iVar8 != iVar2 || (ppuVar6 != ppuVar5))) {
    Interface::disconnectFromCore
              (&((puVar3->_M_t).
                 super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
                 super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
                 super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl)->super_Interface);
    uVar1 = iVar8 + 1;
    if (iVar8 < 0x1f) {
      puVar3 = puVar3 + 1;
    }
    else {
      ppuVar6 = ppuVar6 + (ulong)(iVar8 - 0x1fU >> 5) + 1;
      uVar1 = uVar1 & 0x1f;
      puVar3 = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
               ((long)&((*ppuVar6)->_M_t).
                       super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>
                       .super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl +
               (ulong)(uVar1 * 8));
    }
    uVar9 = (ulong)uVar1;
  }
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&local_60,&this->translators);
  if (((local_60.data)->dataStorage).csize == 0) {
    uVar9 = (ulong)((local_60.data)->dataStorage).bsize;
    ppTVar7 = ((local_60.data)->dataStorage).dataptr;
    if (uVar9 != 0x20) {
      ppTVar7 = ppTVar7 + ((local_60.data)->dataStorage).dataSlotIndex;
      this_00 = *ppTVar7 + uVar9;
      goto LAB_0021d51a;
    }
    if (ppTVar7 == (Translator **)0x0) {
      ppTVar7 = &gmlc::containers::
                 StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>::end
                 ::emptyValue;
    }
    else {
      ppTVar7 = ppTVar7 + (long)((local_60.data)->dataStorage).dataSlotIndex + 1;
    }
  }
  else {
    ppTVar7 = ((local_60.data)->dataStorage).dataptr;
  }
  this_00 = *ppTVar7;
  uVar9 = 0;
LAB_0021d51a:
  iVar2 = ((local_60.data)->dataStorage).bsize;
  ppTVar4 = ((local_60.data)->dataStorage).dataptr;
  if (iVar2 == 0x20) {
    if (ppTVar4 == (Translator **)0x0) {
      ppTVar4 = &gmlc::containers::
                 StableBlockVector<helics::Translator,_5U,_std::allocator<helics::Translator>_>::end
                 ::emptyValue;
    }
    else {
      ppTVar4 = ppTVar4 + (long)((local_60.data)->dataStorage).dataSlotIndex + 1;
    }
    iVar2 = 0;
  }
  else {
    ppTVar4 = ppTVar4 + ((local_60.data)->dataStorage).dataSlotIndex;
  }
  while ((iVar8 = (int)uVar9, iVar8 != iVar2 || (ppTVar7 != ppTVar4))) {
    Interface::disconnectFromCore(&this_00->super_Interface);
    uVar1 = iVar8 + 1;
    if (iVar8 < 0x1f) {
      this_00 = this_00 + 1;
    }
    else {
      ppTVar7 = ppTVar7 + (ulong)(iVar8 - 0x1fU >> 5) + 1;
      uVar1 = uVar1 & 0x1f;
      this_00 = (Translator *)
                ((long)&((*ppTVar7)->super_Interface)._vptr_Interface + (ulong)(uVar1 * 0x50));
    }
    uVar9 = (ulong)uVar1;
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_60.m_handle_lock);
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_48.m_handle_lock);
  return;
}

Assistant:

void ConnectorFederateManager::disconnectAllConnectors()
{
    auto filts = filters.lock();
    filts->modify([](auto& filt) { filt->disconnectFromCore(); });

    auto trans = translators.lock();
    trans->modify([](auto& tran) { tran.disconnectFromCore(); });
}